

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_authorization.c
# Opt level: O1

int IoTHubClient_Auth_Set_xio_Certificate(IOTHUB_AUTHORIZATION_HANDLE handle,XIO_HANDLE xio)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  CREDENTIAL_RESULT *__ptr;
  int iVar3;
  char *pcVar4;
  
  if (handle == (IOTHUB_AUTHORIZATION_HANDLE)0x0 || xio == (XIO_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x109;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
              ,"IoTHubClient_Auth_Set_xio_Certificate",0x108,1,
              "Invalid Parameter handle: %p xio: %p",handle,xio);
    return 0x109;
  }
  if (handle->cred_type != IOTHUB_CREDENTIAL_TYPE_X509_ECC) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x10e;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x10e;
    }
    pcVar4 = "Invalid credential types for this operation";
    iVar3 = 0x10d;
LAB_0012903e:
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
              ,"IoTHubClient_Auth_Set_xio_Certificate",iVar3,1,pcVar4);
    return iVar1;
  }
  __ptr = iothub_device_auth_generate_credentials
                    (handle->device_auth_handle,(DEVICE_AUTH_CREDENTIAL_INFO *)0x0);
  if (__ptr == (CREDENTIAL_RESULT *)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x117;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x117;
    }
    pcVar4 = "Failure generating credentials";
    iVar3 = 0x116;
    goto LAB_0012903e;
  }
  iVar1 = xio_setoption(xio,"x509EccCertificate",(__ptr->auth_cred_result).x509_result.x509_cert);
  if (iVar1 == 0) {
    iVar1 = xio_setoption(xio,"x509EccAliasKey",(__ptr->auth_cred_result).x509_result.x509_alias_key
                         );
    if (iVar1 == 0) {
      iVar1 = 0;
      goto LAB_0012909f;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x123;
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0012909f;
    pcVar4 = "Failure setting x509 key on xio";
    iVar3 = 0x122;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x11e;
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0012909f;
    pcVar4 = "Failure setting x509 cert on xio";
    iVar3 = 0x11d;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
            ,"IoTHubClient_Auth_Set_xio_Certificate",iVar3,1,pcVar4);
LAB_0012909f:
  free(__ptr);
  return iVar1;
}

Assistant:

int IoTHubClient_Auth_Set_xio_Certificate(IOTHUB_AUTHORIZATION_HANDLE handle, XIO_HANDLE xio)
{
    int result;
    if (handle == NULL || xio == NULL)
    {
        LogError("Invalid Parameter handle: %p xio: %p", handle, xio);
        result = MU_FAILURE;
    }
    else if (handle->cred_type != IOTHUB_CREDENTIAL_TYPE_X509_ECC)
    {
        LogError("Invalid credential types for this operation");
        result = MU_FAILURE;
    }
    else
    {
#ifdef USE_PROV_MODULE
        CREDENTIAL_RESULT* cred_result = iothub_device_auth_generate_credentials(handle->device_auth_handle, NULL);
        if (cred_result == NULL)
        {
            LogError("Failure generating credentials");
            result = MU_FAILURE;
        }
        else
        {
            if (xio_setoption(xio, OPTION_X509_ECC_CERT, cred_result->auth_cred_result.x509_result.x509_cert) != 0)
            {
                LogError("Failure setting x509 cert on xio");
                result = MU_FAILURE;
            }
            else if (xio_setoption(xio, OPTION_X509_ECC_KEY, cred_result->auth_cred_result.x509_result.x509_alias_key) != 0)
            {
                LogError("Failure setting x509 key on xio");
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
            free(cred_result);
        }
#else
        LogError("Failed HSM module is not supported");
        result = MU_FAILURE;
#endif
    }
    return result;
}